

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

Var __thiscall Glucose::Solver::newVar(Solver *this,bool sign,bool dvar)

{
  vec<char> *pvVar1;
  unsigned_long *puVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  int size;
  int size_00;
  double dVar7;
  VarData local_48;
  undefined4 local_40;
  undefined4 local_3c;
  long local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,dvar);
  local_40 = (undefined4)CONCAT71(in_register_00000031,sign);
  iVar3 = (this->vardata).sz;
  size = iVar3 * 2 + 1;
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo(&(this->watches).occs,size);
  pvVar1 = &(this->watches).dirty;
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size,(char *)&local_48);
  size_00 = iVar3 * 2 + 2;
  local_38 = (long)iVar3;
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo(&(this->watches).occs,size_00);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size_00,(char *)&local_48);
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo(&(this->watchesBin).occs,size);
  pvVar1 = &(this->watchesBin).dirty;
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size,(char *)&local_48);
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo(&(this->watchesBin).occs,size_00);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size_00,(char *)&local_48);
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo(&(this->unaryWatches).occs,size);
  pvVar1 = &(this->unaryWatches).dirty;
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size,(char *)&local_48);
  vec<Glucose::vec<Glucose::Solver::Watcher>_>::growTo(&(this->unaryWatches).occs,size_00);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::growTo(pvVar1,size_00,(char *)&local_48);
  local_48.reason._0_1_ = 2;
  vec<Glucose::lbool>::push(&this->assigns,(lbool *)&local_48);
  local_48.reason = 0xffffffff;
  local_48.level = 0;
  vec<Glucose::Solver::VarData>::push(&this->vardata,&local_48);
  local_48.reason = 0;
  local_48.level = 0;
  if (this->rnd_init_act == true) {
    dVar7 = this->random_seed * 1389796.0;
    dVar7 = dVar7 - (double)(int)(dVar7 / 2147483647.0) * 2147483647.0;
    this->random_seed = dVar7;
    local_48 = (VarData)((dVar7 / 2147483647.0) * 1e-05);
  }
  vec<double>::push(&this->activity,(double *)&local_48);
  local_48 = (VarData)((ulong)local_48 & 0xffffffffffffff00);
  vec<char>::push(&this->seen,(char *)&local_48);
  local_48 = (VarData)((ulong)local_48 & 0xffffffff00000000);
  vec<unsigned_int>::push(&this->permDiff,&local_48.reason);
  local_48.reason._0_1_ = (char)local_40;
  vec<char>::push(&this->polarity,(char *)&local_48);
  local_48 = (VarData)((ulong)(uint7)local_48._1_7_ << 8);
  vec<char>::push(&this->forceUNSAT,(char *)&local_48);
  pvVar1 = &this->decision;
  vec<char>::push(pvVar1);
  lVar4 = local_38;
  iVar3 = (int)local_38;
  vec<Glucose::Lit>::capacity(&this->trail,iVar3 + 1);
  cVar6 = (char)local_3c;
  if (cVar6 == '\0') {
LAB_001116c2:
    lVar5 = -1;
    if (pvVar1->data[lVar4] == '\0') goto LAB_001116e7;
  }
  else {
    if (pvVar1->data[lVar4] != '\0') {
      if (cVar6 != '\0') goto LAB_001116e7;
      goto LAB_001116c2;
    }
    lVar5 = 1;
  }
  puVar2 = (this->stats).data + 0x12;
  *puVar2 = *puVar2 + lVar5;
LAB_001116e7:
  (this->decision).data[lVar4] = cVar6;
  if ((((this->order_heap).indices.sz <= iVar3) || ((this->order_heap).indices.data[lVar4] < 0)) &&
     (pvVar1->data[lVar4] != '\0')) {
    Heap<Glucose::Solver::VarOrderLt>::insert(&this->order_heap,iVar3);
  }
  return iVar3;
}

Assistant:

Var Solver::newVar(bool sign, bool dvar) {
    int v = nVars();
    watches.init(mkLit(v, false));
    watches.init(mkLit(v, true));
    watchesBin.init(mkLit(v, false));
    watchesBin.init(mkLit(v, true));
    unaryWatches.init(mkLit(v, false));
    unaryWatches.init(mkLit(v, true));
    assigns.push(l_Undef);
    vardata.push(mkVarData(CRef_Undef, 0));
    activity.push(rnd_init_act ? drand(random_seed) * 0.00001 : 0);
    seen.push(0);
    permDiff.push(0);
    polarity.push(sign);
    forceUNSAT.push(0);
    decision.push();
    trail.capacity(v + 1);
    setDecisionVar(v, dvar);
    return v;
}